

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O3

void __thiscall csv::internals::MmapParser::~MmapParser(MmapParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_IBasicCSVParser)._vptr_IBasicCSVParser = (_func_int **)&PTR__MmapParser_00118cc0;
  pcVar2 = (this->_filename)._M_dataplus._M_p;
  paVar1 = &(this->_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  IBasicCSVParser::~IBasicCSVParser(&this->super_IBasicCSVParser);
  return;
}

Assistant:

~MmapParser() {}